

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemTxResult
address_space_rw_riscv32
          (AddressSpace *as,hwaddr addr,MemTxAttrs attrs,void *buf,hwaddr len,_Bool is_write)

{
  MemTxResult MVar1;
  undefined7 in_register_00000089;
  
  if ((int)CONCAT71(in_register_00000089,is_write) == 0) {
    if (len != 0) {
      MVar1 = flatview_read(as->uc,as->current_map,addr,attrs,buf,len);
      return MVar1;
    }
  }
  else if (len != 0) {
    MVar1 = flatview_write(as->uc,as->current_map,addr,attrs,buf,len);
    return MVar1;
  }
  return 0;
}

Assistant:

MemTxResult address_space_rw(AddressSpace *as, hwaddr addr, MemTxAttrs attrs,
                             void *buf, hwaddr len, bool is_write)
{
    if (is_write) {
        return address_space_write(as, addr, attrs, buf, len);
    } else {
        return address_space_read_full(as, addr, attrs, buf, len);
    }
}